

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

tmbstr ParseAttribute(TidyDocImpl *doc,Bool *isempty,Node **asp,Node **php)

{
  Lexer *pLVar1;
  uint uVar2;
  uint uVar3;
  tmbstr ptVar4;
  Node *pNVar5;
  uint uVar6;
  StreamIn *in;
  StreamIn **ppSVar7;
  uint c;
  ulong uVar8;
  bool bVar9;
  
  pLVar1 = doc->lexer;
  *asp = (Node *)0x0;
  *php = (Node *)0x0;
LAB_001463b2:
  uVar2 = prvTidyReadChar(doc->docIn);
  if ((int)uVar2 < 0x2f) {
    uVar3 = 0x28a;
    if ((uVar2 == 0x22) || (uVar2 == 0x27)) {
LAB_001463eb:
      prvTidyReportAttrError(doc,pLVar1->token,(AttVal *)0x0,uVar3);
      goto LAB_001463b2;
    }
    if (uVar2 == 0xffffffff) {
      prvTidyReportAttrError(doc,pLVar1->token,(AttVal *)0x0,0x283);
      prvTidyUngetChar(0xffffffff,doc->docIn);
      return (tmbstr)0x0;
    }
  }
  else if ((int)uVar2 < 0x3d) {
    if (uVar2 == 0x2f) {
      uVar3 = prvTidyReadChar(doc->docIn);
      if (uVar3 == 0x3e) {
        *isempty = yes;
        return (tmbstr)0x0;
      }
      prvTidyUngetChar(uVar3,doc->docIn);
      uVar2 = 0x2f;
LAB_00146521:
      ppSVar7 = &doc->docIn;
      uVar3 = pLVar1->lexsize;
      c = uVar2;
      do {
        if (uVar2 - 0x3d < 2) {
          in = *ppSVar7;
LAB_001466cd:
          prvTidyUngetChar(uVar2,in);
LAB_001466d2:
          uVar6 = pLVar1->lexsize - uVar3;
          if ((int)uVar6 < 1) {
            ptVar4 = (tmbstr)0x0;
          }
          else {
            ptVar4 = prvTidytmbstrndup(doc->allocator,pLVar1->lexbuf + (int)uVar3,uVar6);
          }
          pLVar1->lexsize = uVar3;
          return ptVar4;
        }
        uVar8 = (ulong)uVar2;
        if ((uVar2 == 0x3c) || (uVar2 == 0xffffffff)) {
LAB_001466c6:
          in = *ppSVar7;
          goto LAB_001466cd;
        }
        if ((c == 0x2d) && ((uVar2 == 0x27 || (uVar2 == 0x22)))) {
          pLVar1->lexsize = pLVar1->lexsize - 1;
          goto LAB_001466c6;
        }
        if ((uVar2 < 0x80) && ((lexmap[uVar8] & 8) != 0)) goto LAB_001466d2;
        if (uVar2 == 0x2f) {
          uVar6 = prvTidyReadChar(*ppSVar7);
          in = *ppSVar7;
          if (uVar6 == 0x3e) {
            uVar2 = 0x3e;
            goto LAB_001466cd;
          }
          prvTidyUngetChar(uVar6,in);
          uVar8 = 0x2f;
        }
        uVar2 = (uint)uVar8;
        c = uVar2;
        if (((((doc->config).value[0x54].v != 2) && (*(int *)((doc->config).value + 0x67) == 0)) &&
            (uVar2 < 0x80)) && ((lexmap[uVar8] & 0x40) != 0)) {
          bVar9 = true;
          if (uVar2 < 0x80) {
            bVar9 = (lexmap[uVar8] & 0x40) == 0;
          }
          c = uVar2 + 0x20;
          if (bVar9) {
            c = uVar2;
          }
        }
        prvTidyAddCharToLexer(pLVar1,c);
        uVar2 = prvTidyReadChar(*ppSVar7);
      } while( true );
    }
    if (uVar2 == 0x3c) {
      uVar3 = prvTidyReadChar(doc->docIn);
      if (uVar3 == 0x3f) {
        pLVar1 = doc->lexer;
        pLVar1->txtstart = pLVar1->lexsize;
        uVar3 = prvTidyReadChar(doc->docIn);
        goto joined_r0x0014662f;
      }
      if (uVar3 != 0x25) {
        prvTidyUngetChar(uVar3,doc->docIn);
        prvTidyUngetChar(0x3c,doc->docIn);
        prvTidyReportAttrError(doc,pLVar1->token,(AttVal *)0x0,0x289);
        return (tmbstr)0x0;
      }
      pLVar1 = doc->lexer;
      pLVar1->txtstart = pLVar1->lexsize;
      uVar3 = prvTidyReadChar(doc->docIn);
      goto joined_r0x00146467;
    }
  }
  else {
    if (uVar2 == 0x3d) {
      uVar3 = 0x288;
      goto LAB_001463eb;
    }
    if (uVar2 == 0x3e) {
      return (tmbstr)0x0;
    }
  }
  if ((0x7f < uVar2) || ((lexmap[uVar2] & 8) == 0)) goto LAB_00146521;
  goto LAB_001463b2;
joined_r0x0014662f:
  if (uVar3 == 0xffffffff) {
LAB_0014673b:
    pLVar1->txtend = pLVar1->lexsize;
    if (pLVar1->txtstart < pLVar1->lexsize) {
      pNVar5 = NewToken(doc,PhpTag);
    }
    else {
      pNVar5 = (Node *)0x0;
    }
    pLVar1->txtstart = pLVar1->txtend;
    *php = pNVar5;
    return (tmbstr)0x0;
  }
  prvTidyAddCharToLexer(pLVar1,uVar3);
  if (uVar3 == 0x3f) {
    uVar3 = prvTidyReadChar(doc->docIn);
    if (uVar3 == 0xffffffff) goto LAB_0014673b;
    prvTidyAddCharToLexer(pLVar1,uVar3);
    if (uVar3 == 0x3e) {
      pLVar1->lexsize = pLVar1->lexsize - 2;
      goto LAB_0014673b;
    }
  }
  uVar3 = prvTidyReadChar(doc->docIn);
  goto joined_r0x0014662f;
joined_r0x00146467:
  if (uVar3 == 0xffffffff) {
LAB_0014670a:
    pLVar1->txtend = pLVar1->lexsize;
    if (pLVar1->txtstart < pLVar1->lexsize) {
      pNVar5 = NewToken(doc,AspTag);
    }
    else {
      pNVar5 = (Node *)0x0;
    }
    pLVar1->txtstart = pLVar1->txtend;
    *asp = pNVar5;
    return (tmbstr)0x0;
  }
  prvTidyAddCharToLexer(pLVar1,uVar3);
  if (uVar3 == 0x25) {
    uVar3 = prvTidyReadChar(doc->docIn);
    if (uVar3 == 0xffffffff) goto LAB_0014670a;
    prvTidyAddCharToLexer(pLVar1,uVar3);
    if (uVar3 == 0x3e) {
      pLVar1->lexsize = pLVar1->lexsize - 2;
      goto LAB_0014670a;
    }
  }
  uVar3 = prvTidyReadChar(doc->docIn);
  goto joined_r0x00146467;
}

Assistant:

static tmbstr  ParseAttribute( TidyDocImpl* doc, Bool *isempty,
                              Node **asp, Node **php )
{
    Lexer* lexer = doc->lexer;
    int start, len = 0;
    tmbstr attr = NULL;
    uint c, lastc;

    *asp = NULL;  /* clear asp pointer */
    *php = NULL;  /* clear php pointer */

 /* skip white space before the attribute */

    for (;;)
    {
        c = TY_(ReadChar)( doc->docIn );


        if (c == '/')
        {
            c = TY_(ReadChar)( doc->docIn );

            if (c == '>')
            {
                *isempty = yes;
                return NULL;
            }

            TY_(UngetChar)(c, doc->docIn);
            c = '/';
            break;
        }

        if (c == '>')
            return NULL;

        if (c =='<')
        {
            c = TY_(ReadChar)(doc->docIn);

            if (c == '%')
            {
                *asp = ParseAsp( doc );
                return NULL;
            }
            else if (c == '?')
            {
                *php = ParsePhp( doc );
                return NULL;
            }

            TY_(UngetChar)(c, doc->docIn);
            TY_(UngetChar)('<', doc->docIn);
            TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_GT );
            return NULL;
        }

        if (c == '=')
        {
            TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_EQUALSIGN );
            continue;
        }

        if (c == '"' || c == '\'')
        {
            TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_QUOTEMARK );
            continue;
        }

        if (c == EndOfStream)
        {
            TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_END_OF_FILE_ATTR );
            TY_(UngetChar)(c, doc->docIn);
            return NULL;
        }


        if (!TY_(IsWhite)(c))
           break;
    }

    start = lexer->lexsize;
    lastc = c;

    for (;;)
    {
     /* but push back '=' for parseValue() */
        if (c == '=' || c == '>')
        {
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (c == '<' || c == EndOfStream)
        {
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (lastc == '-' && (c == '"' || c == '\''))
        {
            lexer->lexsize--;
            --len;
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (TY_(IsWhite)(c))
            break;

        if (c == '/') /* Issue #395 - potential self closing tag */
        {
            c = TY_(ReadChar)(doc->docIn);  /* read next */
            if (c == '>')
            {
                /* got a self closing tag - put is back and continue... */
                TY_(UngetChar)(c, doc->docIn);
                break;
            }
            else
            {
                /* Not '/>' - put it back */
                TY_(UngetChar)(c, doc->docIn);
                c = '/';  /* restore original char */
            }
        }

        /* what should be done about non-namechar characters? */
        /* currently these are incorporated into the attr name */

        if ( cfg(doc, TidyUpperCaseAttrs) != TidyUppercasePreserve )
        {
            if ( !cfgBool(doc, TidyXmlTags) && TY_(IsUpper)(c) )
                c = TY_(ToLower)(c);
        }

        TY_(AddCharToLexer)( lexer, c );
        lastc = c;
        c = TY_(ReadChar)(doc->docIn);
    }

    /* handle attribute names with multibyte chars */
    len = lexer->lexsize - start;
    attr = (len > 0 ? TY_(tmbstrndup)(doc->allocator,
                                      lexer->lexbuf+start, len) : NULL);
    lexer->lexsize = start;
    return attr;
}